

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestRunnerMain.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *str;
  char *pcVar1;
  deUint32 dVar2;
  bool bVar3;
  deBool dVar4;
  Platform *platform;
  int iVar5;
  ulong uVar6;
  deUint32 *pdVar7;
  ulong uVar8;
  bool bVar9;
  CommandLine cmdLine;
  DirArchive archive;
  TestRunner runner;
  ApiType local_148;
  char *local_140;
  char *local_138;
  char local_130;
  undefined7 uStack_12f;
  deUint32 local_120;
  ulong local_118;
  DirArchive local_110;
  TestRunner local_e8;
  
  local_140 = &local_130;
  local_148.m_bits = 2;
  local_138 = (char *)0x0;
  local_130 = '\0';
  local_120 = 0;
  bVar3 = argc < 2;
  if (1 < argc) {
    uVar6 = (ulong)(uint)argc;
    uVar8 = 1;
    bVar3 = false;
    local_118 = uVar6;
    do {
      str = argv[uVar8];
      dVar4 = deStringBeginsWith(str,"--type=");
      if (dVar4 == 0) {
        dVar4 = deStringBeginsWith(str,"--logdir=");
        pcVar1 = local_138;
        if (dVar4 == 0) {
          dVar4 = deStringBeginsWith(str,"--summary");
          dVar2 = 8;
          if (dVar4 == 0) {
            dVar4 = deStringEqual(str,"--verbose");
            dVar2 = 3;
            if (dVar4 == 0) break;
          }
        }
        else {
          strlen(str + 9);
          std::__cxx11::string::_M_replace((ulong)&local_140,0,pcVar1,(ulong)(str + 9));
          dVar2 = local_120;
        }
      }
      else {
        if (parseCommandLine(CommandLine&,int,char_const**)::runTypes == '\0') {
          main_cold_1();
        }
        bVar9 = true;
        pdVar7 = &DAT_021d8ef8;
        uVar6 = 0;
        while (dVar4 = deStringEqual(*(char **)(pdVar7 + -2),str + 7), dVar4 == 0) {
          bVar9 = uVar6 < 0xd;
          uVar6 = uVar6 + 1;
          pdVar7 = pdVar7 + 4;
          if (uVar6 == 0xe) goto LAB_00840995;
        }
        local_148.m_bits = *pdVar7;
        uVar6 = local_118;
        dVar2 = local_120;
        if (!bVar9) break;
      }
      local_120 = dVar2;
      uVar8 = uVar8 + 1;
      bVar3 = uVar6 <= uVar8;
    } while (uVar8 != uVar6);
  }
LAB_00840995:
  if (bVar3) {
    platform = createPlatform();
    tcu::DirArchive::DirArchive(&local_110,".");
    glcts::TestRunner::TestRunner
              (&local_e8,platform,&local_110.super_Archive,local_140,local_148,local_120);
    do {
      bVar3 = glcts::TestRunner::iterate(&local_e8);
    } while (bVar3);
    glcts::TestRunner::~TestRunner(&local_e8);
    tcu::DirArchive::~DirArchive(&local_110);
    (*platform->_vptr_Platform[1])(platform);
    iVar5 = 0;
  }
  else {
    printf("%s:\n",*argv);
    puts("  --type=[esN[M]|glNM] Conformance test run type. Choose from");
    puts("                       ES: es2, es3, es31, es32");
    puts("                       GL: gl30, gl31, gl32, gl33, gl40, gl41, gl42, gl43, gl44, gl45");
    puts("  --logdir=[path]      Destination directory for log files");
    puts("  --summary            Print summary without running the tests");
    puts("  --verbose            Print out and log more information");
    iVar5 = -1;
  }
  if (local_140 != &local_130) {
    operator_delete(local_140,CONCAT71(uStack_12f,local_130) + 1);
  }
  return iVar5;
}

Assistant:

int main(int argc, char** argv)
{
	CommandLine cmdLine;

	if (!parseCommandLine(cmdLine, argc, argv))
	{
		printHelp(argv[0]);
		return -1;
	}

	try
	{
		de::UniquePtr<tcu::Platform> platform(createPlatform());
		tcu::DirArchive				 archive(".");
		glcts::TestRunner runner(static_cast<tcu::Platform&>(*platform.get()), archive, cmdLine.dstLogDir.c_str(),
								 cmdLine.runType, cmdLine.flags);

		for (;;)
		{
			if (!runner.iterate())
				break;
		}
	}
	catch (const std::exception& e)
	{
		printf("ERROR: %s\n", e.what());
		return -1;
	}

	return 0;
}